

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O0

IRSample * ConvolutionReverb::GetIRSample(int index)

{
  int index_local;
  
  if (!GetIRSample::initialized) {
    memset(GetIRSample::samples,0,0x4200);
    GetIRSample::initialized = true;
  }
  return GetIRSample::samples + index;
}

Assistant:

inline IRSample& GetIRSample(int index)
    {
        static bool initialized = false;
        static IRSample samples[MAXSAMPLE];
        if (!initialized)
        {
            memset(samples, 0, sizeof(samples));
            initialized = true;
        }
        return samples[index];
    }